

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestRenderbufferFramebuffer
          (GetAttachmentParametersTest *this,bool depth_stencil)

{
  GLenum GVar1;
  undefined4 uVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  size_t sVar8;
  GLchar **ppGVar9;
  undefined7 in_register_00000031;
  long lVar10;
  ulong uVar11;
  GLint parameter_legacy;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLint parameter_dsa;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  GetAttachmentParametersTest *local_1d8;
  undefined4 local_1d0;
  GLenum local_1cc;
  Enum<int,_2UL> local_1c8;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  long lVar7;
  
  local_1d0 = (undefined4)CONCAT71(in_register_00000031,depth_stencil);
  local_1d8 = this;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  bVar4 = true;
  uVar11 = 0;
  do {
    local_1e8 = 0;
    local_1dc = 0;
    if ((uVar11 != 2 | (byte)local_1d0) == 1) {
      GVar1 = TestRenderbufferFramebuffer::attachments[uVar11];
      (**(code **)(lVar7 + 0x830))(0x8d40,GVar1,0x8cd0,&local_1e8);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glGetFramebufferParameteriv has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x110b);
      local_1cc = GVar1;
      (**(code **)(lVar7 + 0x910))(local_1d8->m_fbo,GVar1,0x8cd0,&local_1dc);
      iVar5 = (**(code **)(lVar7 + 0x800))();
      if (iVar5 == 0) {
        if (local_1e8 == local_1dc) {
          if (local_1dc != 0) {
            local_1b8 = uVar11 ^ 2;
            ppGVar9 = TestRenderbufferFramebuffer::optional_pnames_strings;
            lVar10 = 0;
            do {
              GVar1 = local_1cc;
              if (lVar10 != 0x1c || local_1b8 != 0) {
                local_1e0 = 0;
                local_1e4 = 0;
                uVar2 = *(undefined4 *)((long)TestRenderbufferFramebuffer::optional_pnames + lVar10)
                ;
                (**(code **)(lVar7 + 0x830))(0x8d40,local_1cc,uVar2,&local_1e0);
                dVar6 = (**(code **)(lVar7 + 0x800))();
                glu::checkError(dVar6,"glGetFramebufferParameteriv has failed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                                ,0x1150);
                (**(code **)(lVar7 + 0x910))(local_1d8->m_fbo,GVar1,uVar2,&local_1e4);
                iVar5 = (**(code **)(lVar7 + 0x800))();
                if (iVar5 != 0) {
                  local_1b0 = (undefined1  [8])
                              ((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40
                            );
                  local_1c8.m_getName = glu::getErrorName;
                  local_1c8.m_value = iVar5;
                  tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," error when called with ",0x18);
                  pcVar3 = *ppGVar9;
                  if (pcVar3 == (char *)0x0) {
                    std::ios::clear((int)*(_func_int **)(local_1a8._0_8_ + -0x18) + (int)local_1a8);
                  }
                  else {
                    sVar8 = strlen(pcVar3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,pcVar3,sVar8);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," parameter name for ",0x14);
                  pcVar3 = TestRenderbufferFramebuffer::attachments_strings[uVar11];
                  sVar8 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar3,sVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             " attachment of renderbuffer framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                             ,0x5e);
                  std::ostream::operator<<((ostringstream *)local_1a8,local_1e8);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                  bVar4 = false;
                }
                if ((iVar5 == 0) && (local_1e0 != local_1e4)) {
                  local_1b0 = (undefined1  [8])
                              ((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "GetNamedFramebufferAttachmentParameteriv returned ",0x32);
                  std::ostream::operator<<((ostringstream *)local_1a8,local_1e4);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,", but ",6);
                  std::ostream::operator<<((ostringstream *)local_1a8,local_1e0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," was expected for ",0x12);
                  std::ostream::_M_insert<void_const*>((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," parameter name  for ",0x15);
                  pcVar3 = TestRenderbufferFramebuffer::attachments_strings[uVar11];
                  sVar8 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar3,sVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," attachment of renderbuffer framebuffer object.",
                             0x2f);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                  bVar4 = false;
                }
              }
              lVar10 = lVar10 + 4;
              ppGVar9 = ppGVar9 + 1;
            } while (lVar10 != 0x24);
          }
        }
        else {
          local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ",0x32)
          ;
          std::ostream::operator<<((ostringstream *)local_1a8,local_1dc);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but ",6);
          std::ostream::operator<<((ostringstream *)local_1a8,local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of renderbuffer framebuffer object."
                     ,0x6a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar4 = false;
        }
      }
      else {
        local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40);
        local_1c8.m_getName = glu::getErrorName;
        local_1c8.m_value = iVar5;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                   ,0x51);
        pcVar3 = TestRenderbufferFramebuffer::attachments_strings[uVar11];
        sVar8 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," attachment of renderbuffer framebuffer object.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        bVar4 = false;
      }
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 5);
  return bVar4;
}

Assistant:

bool GetAttachmentParametersTest::TestRenderbufferFramebuffer(bool depth_stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_DEPTH_ATTACHMENT, GL_STENCIL_ATTACHMENT, GL_DEPTH_STENCIL_ATTACHMENT,
											   GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };

	static const glw::GLchar* attachments_strings[] = { "GL_DEPTH_ATTACHMENT", "GL_STENCIL_ATTACHMENT",
														"GL_DEPTH_STENCIL_ATTACHMENT", "GL_COLOR_ATTACHMENT0",
														"GL_COLOR_ATTACHMENT1" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		/* Omit DEPTH_STENCIL_ATTACHMENT attachment if the renderbuffer is not depth-stencil. */
		if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
		{
			if (!depth_stencil)
			{
				continue;
			}
		}

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of renderbuffer framebuffer object."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy << " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter "
												   "name of renderbuffer framebuffer object."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = {
				GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME,   GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,	GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,	GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,  GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE,
				GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING
			};

			static const glw::GLchar* optional_pnames_strings[] = {
				"GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME",   "GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",	"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",	"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",  "GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE",
				"GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"
			};

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				/* Omit FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE pname when DEPTH_STENCIL_ATTACHMENT attachment is used. */
				if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
				{
					if (optional_pnames[i] == GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE)
					{
						continue;
					}
				}

				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of renderbuffer framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE "
						   "was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of renderbuffer framebuffer object." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}